

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<const_ON_Geometry_*>::Append
          (ON_SimpleArray<const_ON_Geometry_*> *this,ON_Geometry **x)

{
  int iVar1;
  ON_Geometry *pOVar2;
  uint uVar3;
  ON_Geometry **memblock;
  long lVar4;
  uint uVar5;
  
  uVar3 = *(uint *)(this + 0x10);
  lVar4 = (long)(int)uVar3;
  if (uVar3 == *(uint *)(this + 0x14)) {
    if ((int)uVar3 < 8 || (ulong)(lVar4 * 8) < 0x10000001) {
      uVar5 = 4;
      if (2 < (int)uVar3) {
        uVar5 = uVar3 * 2;
      }
    }
    else {
      uVar5 = 0x2000008;
      if (uVar3 < 0x2000008) {
        uVar5 = uVar3;
      }
      uVar5 = uVar5 + uVar3;
    }
    memblock = x;
    if (x < *(ON_Geometry ***)(this + 8) + lVar4 && *(ON_Geometry ***)(this + 8) <= x) {
      memblock = (ON_Geometry **)onmalloc(8);
      *memblock = *x;
      uVar3 = *(uint *)(this + 0x14);
    }
    if (uVar3 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
    if (*(long *)(this + 8) == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar1 = *(int *)(this + 0x10);
    pOVar2 = *memblock;
    *(int *)(this + 0x10) = iVar1 + 1;
    *(ON_Geometry **)(*(long *)(this + 8) + (long)iVar1 * 8) = pOVar2;
    if (memblock != x) {
      onfree(memblock);
      return;
    }
  }
  else {
    pOVar2 = *x;
    *(uint *)(this + 0x10) = uVar3 + 1;
    *(ON_Geometry **)(*(long *)(this + 8) + lVar4 * 8) = pOVar2;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}